

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void player_generate(player *p,player_race *r,player_class *c,_Bool old_history)

{
  int32_t iVar1;
  level_map_conflict *map;
  char *pcVar2;
  level_conflict *plVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  if (c == (player_class *)0x0) {
    c = p->class;
  }
  if (r == (player_race *)0x0) {
    r = p->race;
  }
  p->class = c;
  p->race = r;
  map = world;
  if ((world != (level_map_conflict *)0x0) && (lVar7 = (long)r->start_lev, lVar7 != 1)) {
    pcVar2 = strstr(world->name,"Dungeon");
    if ((pcVar2 == (char *)0x0) && ((player->opts).opt[0x2b] == false)) {
      iVar1 = *(int32_t *)("You have discovered a trap on the chest!" + lVar7 * 4 + 0x25);
      p->exp = iVar1;
      p->max_exp = iVar1;
      goto LAB_001b4a48;
    }
  }
  p->max_exp = 0;
  p->exp = 0;
  lVar7 = 1;
LAB_001b4a48:
  p->lev = (int16_t)lVar7;
  p->max_lev = (int16_t)lVar7;
  if (map != (level_map_conflict *)0x0) {
    pcVar2 = strstr(map->name,"Dungeon");
    if (pcVar2 == (char *)0x0) {
      if ((player->opts).opt[0x2b] == true) {
        p->home = 0;
      }
      else {
        plVar3 = level_by_name(map,r->hometown);
        p->home = (int16_t)plVar3->index;
      }
    }
    else {
      p->home = 1;
      pcVar2 = option_name(0x2b);
      option_set(pcVar2,0);
    }
  }
  uVar4 = p->class->c_mhp + p->race->r_mhp;
  p->hitdie = (uint8_t)uVar4;
  p->player_hp[0] = (ushort)uVar4 & 0xff;
  uVar6 = (uint)p->lev;
  if (1 < (int)uVar6) {
    uVar5 = (uint)(ushort)((short)(uVar4 & 0xff) + p->player_hp[0]);
    lVar7 = 0;
    do {
      p->player_hp[lVar7 + 1] = (int16_t)uVar5;
      uVar5 = uVar5 + (uVar4 & 0xff);
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar6 - 1 != lVar7);
  }
  p->mhp = p->player_hp[(long)(int)uVar6 + -1];
  get_ahw(p);
  p->timed[10] = (short)PY_FOOD_FULL + -1;
  if (!old_history) {
    if (p->history != (char *)0x0) {
      string_free(p->history);
    }
    pcVar2 = get_history(p->race->history);
    p->history = pcVar2;
  }
  return;
}

Assistant:

void player_generate(struct player *p, const struct player_race *r,
					 const struct player_class *c, bool old_history)
{
	int i;

	if (!c)
		c = p->class;
	if (!r)
		r = p->race;

	p->class = c;
	p->race = r;

	/* Set the level */
	get_level(p);

	/* Hitdice */
	p->hitdie = p->race->r_mhp + p->class->c_mhp;

	/* Pre-calculate level 1 hitdice */
	p->player_hp[0] = p->hitdie;

	/*
	 * Fill in overestimates of hitpoints for additional levels.  Do not
	 * do the actual rolls so the player can not reset the birth screen
	 * to get a desirable set of initial rolls.
	 */
	for (i = 1; i < p->lev; i++) {
		p->player_hp[i] = p->player_hp[i - 1] + p->hitdie;
	}

	/* Initial hitpoints */
	p->mhp = p->player_hp[p->lev - 1];

	/* Roll for age/height/weight */
	get_ahw(p);

	/* Always start with a well fed player */
	p->timed[TMD_FOOD] = PY_FOOD_FULL - 1;

	if (!old_history) {
		if (p->history) {
			string_free(p->history);
		}
		p->history = get_history(p->race->history);
	}
}